

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::Normalizer2WithImpl::normalizeSecondAndAppend
          (Normalizer2WithImpl *this,UnicodeString *first,UnicodeString *second,UBool doNormalize,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  char16_t *pcVar5;
  undefined1 local_c8 [8];
  ReorderingBuffer buffer;
  UnicodeString safeMiddle;
  int32_t firstLength;
  UChar *secondArray;
  UErrorCode *errorCode_local;
  UBool doNormalize_local;
  UnicodeString *second_local;
  UnicodeString *first_local;
  Normalizer2WithImpl *this_local;
  
  uprv_checkCanGetBuffer(first,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pcVar5 = icu_63::UnicodeString::getBuffer(second);
    if ((first == second) || (pcVar5 == (char16_t *)0x0)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      iVar2 = icu_63::UnicodeString::length(first);
      icu_63::UnicodeString::UnicodeString((UnicodeString *)&buffer.codePointLimit);
      ReorderingBuffer::ReorderingBuffer((ReorderingBuffer *)local_c8,this->impl,first);
      iVar3 = icu_63::UnicodeString::length(second);
      iVar4 = ReorderingBuffer::init
                        ((ReorderingBuffer *)local_c8,(EVP_PKEY_CTX *)(ulong)(uint)(iVar2 + iVar3));
      if ((char)iVar4 != '\0') {
        iVar3 = icu_63::UnicodeString::length(second);
        (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x13])
                  (this,pcVar5,pcVar5 + iVar3,(ulong)(uint)(int)doNormalize,&buffer.codePointLimit,
                   local_c8,errorCode);
      }
      ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_c8);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') {
        iVar3 = icu_63::UnicodeString::length((UnicodeString *)&buffer.codePointLimit);
        icu_63::UnicodeString::replace
                  (first,iVar2 - iVar3,0x7fffffff,(UnicodeString *)&buffer.codePointLimit);
      }
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)&buffer.codePointLimit);
    }
  }
  return first;
}

Assistant:

UnicodeString &
    normalizeSecondAndAppend(UnicodeString &first,
                             const UnicodeString &second,
                             UBool doNormalize,
                             UErrorCode &errorCode) const {
        uprv_checkCanGetBuffer(first, errorCode);
        if(U_FAILURE(errorCode)) {
            return first;
        }
        const UChar *secondArray=second.getBuffer();
        if(&first==&second || secondArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return first;
        }
        int32_t firstLength=first.length();
        UnicodeString safeMiddle;
        {
            ReorderingBuffer buffer(impl, first);
            if(buffer.init(firstLength+second.length(), errorCode)) {
                normalizeAndAppend(secondArray, secondArray+second.length(), doNormalize,
                                   safeMiddle, buffer, errorCode);
            }
        }  // The ReorderingBuffer destructor finalizes the first string.
        if(U_FAILURE(errorCode)) {
            // Restore the modified suffix of the first string.
            first.replace(firstLength-safeMiddle.length(), 0x7fffffff, safeMiddle);
        }
        return first;
    }